

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuLaunchFunctsC.H
# Opt level: O0

void amrex::
     ParallelFor<Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__0>
               (Box *box,anon_class_136_3_59341dd0 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *in_RDI;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int iVar6;
  int local_f8;
  int local_f4;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[3];
  iVar4 = in_RDI[4];
  iVar5 = in_RDI[5];
  for (local_f4 = in_RDI[2]; local_f8 = iVar2, local_f4 <= iVar5; local_f4 = local_f4 + 1) {
    for (; iVar6 = iVar1, local_f8 <= iVar4; local_f8 = local_f8 + 1) {
      for (; iVar6 <= iVar3; iVar6 = iVar6 + 1) {
        detail::
        call_f<Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__0>
                  ((anon_class_136_3_59341dd0 *)CONCAT44(iVar6,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
      }
    }
  }
  return;
}

Assistant:

void ParallelFor (Box const& box, L&& f) noexcept
{
    const auto lo = amrex::lbound(box);
    const auto hi = amrex::ubound(box);
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        detail::call_f(f,i,j,k);
    }}}
}